

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_bcons.cc
# Opt level: O2

void * v2i_BASIC_CONSTRAINTS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *values)

{
  char *__s1;
  int iVar1;
  BASIC_CONSTRAINTS *a;
  size_t sVar2;
  CONF_VALUE *value;
  size_t i;
  ulong i_00;
  
  a = BASIC_CONSTRAINTS_new();
  if (a == (BASIC_CONSTRAINTS *)0x0) {
LAB_0020cb14:
    a = (BASIC_CONSTRAINTS *)0x0;
  }
  else {
    i_00 = 0;
    while( true ) {
      sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)values);
      if (sVar2 <= i_00) break;
      value = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)values,i_00);
      __s1 = value->name;
      if (((*__s1 != 'C') || (__s1[1] != 'A')) || (__s1[2] != '\0')) {
        iVar1 = strcmp(__s1,"pathlen");
        if (iVar1 == 0) {
          iVar1 = X509V3_get_value_int(value,&a->pathlen);
          goto LAB_0020caaf;
        }
        ERR_put_error(0x14,0,0x7b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_bcons.cc"
                      ,0x56);
        ERR_add_error_data(6,"section:",value->section,",name:",value->name,",value:",value->value);
LAB_0020cb0c:
        BASIC_CONSTRAINTS_free(a);
        goto LAB_0020cb14;
      }
      iVar1 = X509V3_get_value_bool(value,&a->ca);
LAB_0020caaf:
      if (iVar1 == 0) goto LAB_0020cb0c;
      i_00 = i_00 + 1;
    }
  }
  return a;
}

Assistant:

static void *v2i_BASIC_CONSTRAINTS(const X509V3_EXT_METHOD *method,
                                   const X509V3_CTX *ctx,
                                   const STACK_OF(CONF_VALUE) *values) {
  BASIC_CONSTRAINTS *bcons = NULL;
  if (!(bcons = BASIC_CONSTRAINTS_new())) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(values); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(values, i);
    if (!strcmp(val->name, "CA")) {
      if (!X509V3_get_value_bool(val, &bcons->ca)) {
        goto err;
      }
    } else if (!strcmp(val->name, "pathlen")) {
      if (!X509V3_get_value_int(val, &bcons->pathlen)) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NAME);
      X509V3_conf_err(val);
      goto err;
    }
  }
  return bcons;
err:
  BASIC_CONSTRAINTS_free(bcons);
  return NULL;
}